

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffixtree.cpp
# Opt level: O3

void __thiscall
SuffixTree::GeneralizedSuffixTree::BuildSuffixTreeFromFile
          (GeneralizedSuffixTree *this,string *filename)

{
  uint *puVar1;
  char symbol;
  uint uVar2;
  pointer pbVar3;
  bool bVar4;
  uint uVar5;
  FILE *__stream;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  long lVar9;
  ulong uVar10;
  pointer pbVar11;
  Node *pNVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  uint pos;
  int iVar13;
  Node *pNVar14;
  ulong uVar15;
  undefined1 local_468 [8];
  char strbuf [1024];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  uint local_40;
  uint local_3c;
  undefined8 local_38;
  
  puts("Loading strings...");
  __stream = fopen((filename->_M_dataplus)._M_p,"r");
  if (__stream == (FILE *)0x0) {
    __return_storage_ptr__ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         __cxa_allocate_exception(0x20);
    local_468 = (undefined1  [8])(strbuf + 8);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"Can not open file: ","");
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_468,
                   filename);
    __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string
               );
  }
  pcVar6 = fgets(local_468,0x400,__stream);
  if (pcVar6 == (char *)0x0) {
    local_38 = (ulong)local_38._4_4_ << 0x20;
  }
  else {
    local_38 = (ulong)local_38._4_4_ << 0x20;
    do {
      sVar7 = strlen(local_468);
      iVar13 = (int)sVar7;
      if (iVar13 != 0) {
        strbuf[(ulong)(iVar13 - 1) - 8] = '\0';
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        sVar7 = strlen(local_468);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,local_468,strbuf + (sVar7 - 8));
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,
                   &local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        local_38 = CONCAT44(local_38._4_4_,(int)local_38 + iVar13);
      }
      pcVar6 = fgets(local_468,0x400,__stream);
    } while (pcVar6 != (char *)0x0);
  }
  fclose(__stream);
  puts("\r\rStrings were loaded successfully");
  if ((int)local_38 == 0) {
    pcVar6 = (char *)malloc(0x60);
    sVar7 = 0x10;
  }
  else {
    uVar10 = local_38 & 0xffffffff;
    pcVar6 = (char *)malloc(uVar10 * 0x60);
    sVar7 = uVar10 << 4;
  }
  pcVar8 = (char *)malloc(sVar7);
  this->nodes = pcVar6;
  this->leaves = pcVar8;
  uVar2 = this->nodes_num;
  this->nodes_num = uVar2 + 1;
  lVar9 = (ulong)uVar2 * 0x60;
  pNVar14 = (Node *)(pcVar6 + lVar9);
  pcVar6 = pcVar6 + lVar9;
  pcVar6[0] = '\0';
  pcVar6[1] = '\0';
  pcVar6[2] = '\0';
  pcVar6[3] = '\0';
  pcVar6[4] = '\0';
  pcVar6[5] = '\0';
  pcVar6[6] = '\0';
  pcVar6[7] = '\0';
  *(Node **)(pcVar6 + 0x10) = pNVar14;
  *(Node **)(pcVar6 + 0x18) = pNVar14;
  pcVar6[0x20] = '\0';
  pcVar6[0x21] = '\0';
  pcVar6[0x22] = '\0';
  pcVar6[0x23] = '\0';
  pcVar6[0x24] = '\0';
  pcVar6[0x25] = '\0';
  pcVar6[0x26] = '\0';
  pcVar6[0x27] = '\0';
  *(char **)(pcVar6 + 0x28) = pcVar6 + 0x58;
  pcVar6[0x30] = '\x01';
  pcVar6[0x31] = '\0';
  pcVar6[0x32] = '\0';
  pcVar6[0x33] = '\0';
  pcVar6[0x34] = '\0';
  pcVar6[0x35] = '\0';
  pcVar6[0x36] = '\0';
  pcVar6[0x37] = '\0';
  pcVar6[0x38] = '\0';
  pcVar6[0x39] = '\0';
  pcVar6[0x3a] = '\0';
  pcVar6[0x3b] = '\0';
  pcVar6[0x3c] = '\0';
  pcVar6[0x3d] = '\0';
  pcVar6[0x3e] = '\0';
  pcVar6[0x3f] = '\0';
  pcVar6[0x40] = '\0';
  pcVar6[0x41] = '\0';
  pcVar6[0x42] = '\0';
  pcVar6[0x43] = '\0';
  pcVar6[0x44] = '\0';
  pcVar6[0x45] = '\0';
  pcVar6[0x46] = '\0';
  pcVar6[0x47] = '\0';
  pcVar6[0x48] = '\0';
  pcVar6[0x49] = '\0';
  pcVar6[0x4a] = -0x80;
  pcVar6[0x4b] = '?';
  pcVar6[0x50] = '\0';
  pcVar6[0x51] = '\0';
  pcVar6[0x52] = '\0';
  pcVar6[0x53] = '\0';
  pcVar6[0x54] = '\0';
  pcVar6[0x55] = '\0';
  pcVar6[0x56] = '\0';
  pcVar6[0x57] = '\0';
  pcVar6[0x58] = '\0';
  pcVar6[0x59] = '\0';
  pcVar6[0x5a] = '\0';
  pcVar6[0x5b] = '\0';
  pcVar6[0x5c] = '\0';
  pcVar6[0x5d] = '\0';
  pcVar6[0x5e] = '\0';
  pcVar6[0x5f] = '\0';
  this->root = pNVar14;
  *(Node **)(pcVar6 + 8) = pNVar14;
  this->active_node = pNVar14;
  this->active_edge = 0;
  this->active_length = 0;
  this->remainder = 0;
  lVar9 = (long)(this->strings).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->strings).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar9 != 0) {
    uVar10 = lVar9 >> 5;
    uVar15 = 0;
    do {
      printf("\rBuilding tree: %.2f %%",SUB84((double)(((float)uVar15 * 100.0) / (float)uVar10),0));
      strbuf._1016_8_ = uVar15 * 0x20;
      pbVar11 = (this->strings).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar15;
      local_40 = (int)uVar15 << 8;
      uVar10 = 0;
      local_38 = uVar15;
      do {
        symbol = (pbVar11->_M_dataplus)._M_p[uVar10];
        local_3c = (int)symbol;
        if (symbol == '\0') {
          local_3c = local_40;
        }
        puVar1 = &this->remainder;
        *puVar1 = *puVar1 + 1;
        pos = (uint)uVar10;
        if (*puVar1 != 0) {
          pNVar14 = (Node *)0x0;
          do {
            pNVar12 = this->active_node;
            bVar4 = AddSymbol(this,symbol);
            if (bVar4) {
              if (pNVar14 != (Node *)0x0) {
                pNVar14->suffix_link = pNVar12;
              }
              break;
            }
            if (this->active_length == 0) {
              InsertLeaf(this,local_3c,(uint)local_38,pos);
              pNVar12 = this->active_node;
            }
            else {
              pNVar12 = InsertNode(this,local_3c,(uint)local_38,pos);
            }
            if (pNVar14 != (Node *)0x0) {
              pNVar14->suffix_link = pNVar12;
            }
            if (this->active_node == this->root) {
              if (this->active_length != 0) {
                uVar5 = this->active_length - 1;
                this->active_length = uVar5;
                goto LAB_00104a01;
              }
            }
            else {
              this->active_node = this->active_node->suffix_link;
              uVar5 = this->active_length;
              if (uVar5 != 0) {
LAB_00104a01:
                Move(this,(uint)local_38,pos - uVar5);
              }
            }
            puVar1 = &this->remainder;
            *puVar1 = *puVar1 - 1;
            pNVar14 = pNVar12;
          } while (*puVar1 != 0);
        }
        uVar10 = (ulong)(pos + 1);
        pbVar3 = (this->strings).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pbVar11 = (pointer)((long)&(pbVar3->_M_dataplus)._M_p + strbuf._1016_8_);
      } while (uVar10 <= *(ulong *)((long)&pbVar3->_M_string_length + strbuf._1016_8_));
      uVar15 = (ulong)((int)local_38 + 1);
      uVar10 = (long)(this->strings).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5;
    } while (uVar15 < uVar10);
  }
  puts("\rTree was built successfully");
  return;
}

Assistant:

void GeneralizedSuffixTree::BuildSuffixTreeFromFile (std::string filename)
{
    // load strings from file
    printf ("Loading strings...\n");
    FILE *file = fopen (filename.c_str(), "r");
    if (!file)
        throw std::string ("Can not open file: ") + filename;
    char strbuf[1024];
    uint symbols_num = 0;
    while (fgets (strbuf, 1024, file))
    {
        uint len = strlen (strbuf);
        if (len > 0)
        {
            strbuf[len - 1] = '\0';
            strings.push_back (strbuf);
            symbols_num += len;
        }
    }
    fclose (file);
    printf ("\r\rStrings were loaded successfully\n");
    // allocate space for nodes and leaves
	if (symbols_num)
	{
		nodes = static_cast<char *> (malloc (symbols_num * sizeof (Node)));
		leaves = static_cast<char *> (malloc (symbols_num * sizeof (Leaf)));
	}
    else
	{
		nodes = static_cast<char *> (malloc (sizeof (Node)));
		leaves = static_cast<char *> (malloc (sizeof (Leaf)));
	}
    // build tree
    root = AllocNode (nullptr, nullptr);
    root->suffix_link = root;
    active_node = root;
    active_edge = 0;
    active_length = 0;
    remainder = 0;
    for (uint i = 0; i < strings.size(); ++i)
    {
        printf ("\rBuilding tree: %.2f %%", i * 100.0f / strings.size());
        for (uint j = 0; j <= strings[i].size(); ++j)
        {
            char symbol = strings[i][j];
            uint letter = MakeLetter (symbol, i);
            Node *last_inserted_node = nullptr;
            ++remainder;
            while (remainder)
            {
                // try add symbol
                Node *old_active_node = active_node;
                if (AddSymbol (symbol))
                {
                    if (last_inserted_node)
                        last_inserted_node->suffix_link = old_active_node;
                    break;
                }
                // insert node or leaf
                if (active_length)
                {
                    // insert node
                    Node *node = InsertNode (letter, i, j);
                    if (last_inserted_node)
                        last_inserted_node->suffix_link = node;
                    last_inserted_node = node;
                }
                else
                {
                    // insert leaf
                    InsertLeaf (letter, i, j);
                    if (last_inserted_node)
                        last_inserted_node->suffix_link = active_node;
                    last_inserted_node = active_node;
                }
                // move to next active point
                if (active_node != root)
                {
                    active_node = active_node->suffix_link;
                    if (active_length)
                        Move (i, j - active_length);
                }
                else if (active_length)
                {
                    --active_length;
                    Move (i, j - active_length);
                }
                --remainder;
            }
        }
    }
    printf ("\rTree was built successfully\n");
}